

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::CodePointToUtf8_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,UInt32 code_point)

{
  undefined1 uVar1;
  long lVar2;
  byte bVar3;
  long *plVar4;
  size_t sVar5;
  long *plVar6;
  size_type *psVar7;
  undefined1 uVar8;
  uint uVar9;
  char str [5];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  string local_30;
  
  uVar9 = (uint)this;
  if (0x1fffff < uVar9) {
    String::FormatHexInt_abi_cxx11_(&local_30,(String *)this,code_point);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x18ccef);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_40 = *plVar6;
      lStack_38 = plVar4[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar6;
      local_50 = (long *)*plVar4;
    }
    local_48 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar7) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
  if (uVar9 < 0x80) {
    local_50 = (long *)((ulong)local_50 & 0xffffffffffff0000);
LAB_00158438:
    local_50 = (long *)CONCAT71(local_50._1_7_,(char)this);
  }
  else {
    uVar8 = SUB81(this,0);
    if (uVar9 < 0x800) {
      local_50._1_7_ = CONCAT61((int6)((ulong)local_50 >> 0x10),uVar8) & 0xffffffffff003f | 0x80;
      bVar3 = (byte)((ulong)this >> 6) | 0xc0;
    }
    else {
      uVar1 = (undefined1)((ulong)this >> 6);
      bVar3 = (byte)((ulong)this >> 0xc);
      if (0xffff < uVar9) {
        local_50 = (long *)((ulong)(CONCAT61(CONCAT51(CONCAT41((int)((ulong)local_50 >> 0x20),uVar8)
                                                      ,uVar1),bVar3) & 0xffffff003f3f3f | 0x808080)
                           << 8);
        this = (internal *)(ulong)(byte)((byte)(uVar9 >> 0x12) | 0xf0);
        goto LAB_00158438;
      }
      local_50._1_7_ =
           CONCAT61(CONCAT51((int5)((ulong)local_50 >> 0x18),uVar8),uVar1) & 0xffffffff003f3f |
           0x8080;
      bVar3 = bVar3 | 0xe0;
    }
    local_50 = (long *)CONCAT71(local_50._1_7_,bVar3);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar5 = strlen((char *)&local_50);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,&local_50,(long)&local_50 + sVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string CodePointToUtf8(UInt32 code_point) {
  if (code_point > kMaxCodePoint4) {
    return "(Invalid Unicode 0x" + String::FormatHexInt(code_point) + ")";
  }

  char str[5];  // Big enough for the largest valid code point.
  if (code_point <= kMaxCodePoint1) {
    str[1] = '\0';
    str[0] = static_cast<char>(code_point);                          // 0xxxxxxx
  } else if (code_point <= kMaxCodePoint2) {
    str[2] = '\0';
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xC0 | code_point);                   // 110xxxxx
  } else if (code_point <= kMaxCodePoint3) {
    str[3] = '\0';
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xE0 | code_point);                   // 1110xxxx
  } else {  // code_point <= kMaxCodePoint4
    str[4] = '\0';
    str[3] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xF0 | code_point);                   // 11110xxx
  }
  return str;
}